

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

void __thiscall
llama_context::llama_context(llama_context *this,llama_model *model,llama_context_params params)

{
  llama_cparams *cparams;
  _Rb_tree_header *p_Var1;
  ggml_backend_sched_ptr *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  llama_pooling_type lVar5;
  uint32_t uVar6;
  pointer ppgVar7;
  ggml_backend_device *pgVar8;
  pointer puVar9;
  llama_kv_cache_unified *plVar10;
  pointer ppgVar11;
  pointer ppgVar12;
  pointer pfVar13;
  ggml_backend_buffer_type *pgVar14;
  llama_context_params lVar15;
  bool bVar16;
  byte bVar17;
  char cVar18;
  int iVar19;
  uint uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  int32_t iVar23;
  llama_token lVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ggml_backend_t pgVar28;
  long lVar29;
  undefined8 uVar30;
  llama_kv_cache_unified *plVar31;
  size_t sVar32;
  size_t sVar33;
  long lVar34;
  pointer __p;
  llama_ubatch *plVar35;
  runtime_error *prVar36;
  undefined8 uVar37;
  uint uVar38;
  char *pcVar39;
  llama_pooling_type lVar40;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_3;
  ulong uVar41;
  pointer puVar42;
  pointer ppgVar43;
  unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *puVar44;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_2;
  long lVar45;
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ggml_backend_t backend;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *__range2;
  ggml_backend_set_n_threads_t ggml_backend_set_n_threads_fn;
  uint local_b8;
  undefined4 local_b4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ggml_backend_buffer_ptr *local_80;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *local_78;
  int local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_68;
  unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *local_60;
  vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
  *local_58;
  vector<ggml_backend*,std::allocator<ggml_backend*>> *local_50;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  llama_model *local_38;
  
  lVar15 = params;
  this->model = model;
  (this->cvec).layer_start = -1;
  (this->cvec).layer_end = -1;
  (this->cvec).ctxs.
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cvec).ctxs.
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cvec).ctxs.
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cvec).bufs.
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cvec).bufs.
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cvec).bufs.
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cvec).tensors.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cvec).tensors.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cvec).tensors.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loras)._M_h._M_buckets = &(this->loras)._M_h._M_single_bucket;
  (this->loras)._M_h._M_bucket_count = 1;
  (this->loras)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loras)._M_h._M_element_count = 0;
  (this->loras)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loras)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loras)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar44 = &this->kv_self;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->embd_seq)._M_t._M_impl.super__Rb_tree_header;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&(this->sbatch).ids,0,0x129);
  this->logits_size = 0;
  this->logits = (float *)0x0;
  this->embd_size = 0;
  this->embd = (float *)0x0;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->sched;
  __range2 = &this->backends;
  local_58 = (vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
              *)&this->set_n_threads_fns;
  local_50 = (vector<ggml_backend*,std::allocator<ggml_backend*>> *)&this->backend_ptrs;
  local_78 = &this->backend_buft;
  local_68 = &this->buf_compute_meta;
  local_80 = &this->buf_output;
  memset(&(this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xe1);
  this->t_start_us = 0;
  this->t_load_us = 0;
  this->t_p_eval_us = 0;
  this->t_eval_us = 0;
  this->t_compute_start_us = 0;
  this->n_queued_tokens = 0;
  this->n_p_eval = 0;
  this->n_eval = 0;
  local_60 = puVar44;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: constructing llama_context\n","llama_context");
  uVar2 = model->t_load_us;
  uVar3 = model->t_start_us;
  auVar46._8_4_ = (int)uVar2;
  auVar46._0_8_ = uVar3;
  auVar46._12_4_ = (int)((ulong)uVar2 >> 0x20);
  this->t_start_us = uVar3;
  this->t_load_us = auVar46._8_8_;
  uVar38 = params.n_seq_max + (params.n_seq_max == 0);
  (this->cparams).n_seq_max = uVar38;
  (this->cparams).n_threads = params.n_threads;
  (this->cparams).n_threads_batch = params.n_threads_batch;
  (this->cparams).yarn_ext_factor = params.yarn_ext_factor;
  (this->cparams).yarn_attn_factor = params.yarn_attn_factor;
  (this->cparams).yarn_beta_fast = params.yarn_beta_fast;
  (this->cparams).yarn_beta_slow = params.yarn_beta_slow;
  (this->cparams).defrag_thold = params.defrag_thold;
  (this->cparams).embeddings = params.embeddings;
  (this->cparams).offload_kqv = params.offload_kqv;
  (this->cparams).flash_attn = params.flash_attn;
  params.no_perf = lVar15.no_perf;
  (this->cparams).no_perf = params.no_perf;
  (this->cparams).pooling_type = params.pooling_type;
  (this->cparams).warmup = false;
  uVar20 = (model->hparams).n_ctx_train;
  if (params.n_ctx == 0) {
    params.n_ctx = uVar20;
  }
  (this->cparams).n_ctx = params.n_ctx;
  (this->cparams).rope_freq_base =
       (float)(~-(uint)(params.rope_freq_base == 0.0) & (uint)params.rope_freq_base |
              (uint)(model->hparams).rope_freq_base_train & -(uint)(params.rope_freq_base == 0.0));
  (this->cparams).rope_freq_scale =
       (float)(~-(uint)(params.rope_freq_scale == 0.0) & (uint)params.rope_freq_scale |
              (uint)(model->hparams).rope_freq_scale_train & -(uint)(params.rope_freq_scale == 0.0))
  ;
  uVar25 = (model->hparams).n_ctx_orig_yarn;
  if (uVar25 == 0) {
    uVar25 = uVar20;
  }
  if (params.yarn_orig_ctx != 0) {
    uVar25 = params.yarn_orig_ctx;
  }
  (this->cparams).n_ctx_orig_yarn = uVar25;
  (this->cparams).cb_eval = params.cb_eval;
  (this->cparams).cb_eval_user_data = params.cb_eval_user_data;
  if (params.rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_UNSPECIFIED) {
    params.rope_scaling_type = (model->hparams).rope_scaling_type_train;
  }
  if (params.rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_NONE) {
    (this->cparams).rope_freq_scale = 1.0;
  }
  fVar47 = 0.0;
  if (params.yarn_ext_factor < 0.0) {
    if (params.rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_YARN) {
      fVar47 = 1.0;
    }
    (this->cparams).yarn_ext_factor = fVar47;
  }
  (this->cparams).yarn_attn_factor = params.yarn_attn_factor * (model->hparams).rope_attn_factor;
  if (params.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
    lVar5 = (model->hparams).pooling_type;
    lVar40 = LLAMA_POOLING_TYPE_NONE;
    if (lVar5 != LLAMA_POOLING_TYPE_UNSPECIFIED) {
      lVar40 = lVar5;
    }
    (this->cparams).pooling_type = lVar40;
  }
  uVar4 = params.attention_type == LLAMA_ATTENTION_TYPE_CAUSAL;
  if (params.attention_type == LLAMA_ATTENTION_TYPE_UNSPECIFIED) {
    uVar4 = (model->hparams).causal_attn;
  }
  (this->cparams).causal_attn = (bool)uVar4;
  uVar20 = params.n_ctx;
  if (params.n_batch < params.n_ctx) {
    uVar20 = params.n_batch;
  }
  if ((uVar4 & 1) == 0) {
    uVar20 = params.n_batch;
  }
  (this->cparams).n_batch = uVar20;
  if (uVar20 < 0x40) {
    uVar20 = 0x40;
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_batch is less than GGML_KQ_MASK_PAD - increasing to %d\n",
                       "llama_context",0x40);
    (this->cparams).n_batch = 0x40;
    params.n_ctx = (this->cparams).n_ctx;
    uVar38 = (this->cparams).n_seq_max;
  }
  if (params.n_ubatch != 0) {
    params.n_batch = params.n_ubatch;
  }
  if (uVar20 <= params.n_batch) {
    params.n_batch = uVar20;
  }
  (this->cparams).n_ubatch = params.n_batch;
  uVar41 = (ulong)params.n_ctx / (ulong)uVar38;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_seq_max     = %u\n","llama_context");
  cparams = &this->cparams;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx         = %u\n","llama_context",
                     (ulong)cparams->n_ctx);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_per_seq = %u\n","llama_context",uVar41);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_batch       = %u\n","llama_context",
                     (ulong)(this->cparams).n_batch);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ubatch      = %u\n","llama_context",
                     (ulong)(this->cparams).n_ubatch);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: causal_attn   = %d\n","llama_context",
                     (ulong)(this->cparams).causal_attn);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: flash_attn    = %d\n","llama_context",
                     (ulong)(this->cparams).flash_attn);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: freq_base     = %.1f\n",
                     (double)(this->cparams).rope_freq_base,"llama_context");
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: freq_scale    = %g\n",
                     (double)(this->cparams).rope_freq_scale,"llama_context");
  uVar20 = (model->hparams).n_ctx_train;
  if ((uint)uVar41 < uVar20) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_ctx_per_seq (%u) < n_ctx_train (%u) -- the full capacity of the model will not be utilized\n"
                       ,"llama_context",uVar41);
    uVar20 = (model->hparams).n_ctx_train;
  }
  if (uVar20 < (uint)uVar41) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_ctx_pre_seq (%u) > n_ctx_train (%u) -- possible training context overflow\n"
                       ,"llama_context",uVar41);
  }
  this->logits_all = params.logits_all;
  bVar17 = (model->hparams).vocab_only;
  if ((bool)bVar17 == false) {
    ppgVar7 = (model->devices).
              super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppgVar43 = (model->devices).
                    super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppgVar43 != ppgVar7;
        ppgVar43 = ppgVar43 + 1) {
      pgVar8 = *ppgVar43;
      backend = (ggml_backend_t)ggml_backend_dev_init(pgVar8,0);
      if (backend == (ggml_backend_t)0x0) {
        prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar37 = ggml_backend_dev_name(pgVar8);
        format_abi_cxx11_((string *)&ggml_backend_set_n_threads_fn,"failed to initialize %s backend"
                          ,uVar37);
        std::runtime_error::runtime_error(prVar36,(string *)&ggml_backend_set_n_threads_fn);
        __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
      ::emplace_back<ggml_backend*&>
                ((vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
                  *)__range2,&backend);
    }
    for (uVar41 = 0; uVar27 = ggml_backend_dev_count(), uVar41 < uVar27; uVar41 = uVar41 + 1) {
      uVar37 = ggml_backend_dev_get(uVar41);
      iVar19 = ggml_backend_dev_type();
      if (iVar19 == 2) {
        backend = (ggml_backend_t)ggml_backend_dev_init(uVar37,0);
        if (backend == (ggml_backend_t)0x0) {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar37 = ggml_backend_dev_name(uVar37);
          format_abi_cxx11_((string *)&ggml_backend_set_n_threads_fn,
                            "failed to initialize %s backend",uVar37);
          std::runtime_error::runtime_error(prVar36,(string *)&ggml_backend_set_n_threads_fn);
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
        ::emplace_back<ggml_backend*&>
                  ((vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
                    *)__range2,&backend);
      }
    }
    pgVar28 = (ggml_backend_t)ggml_backend_init_by_type(0,0);
    this->backend_cpu = pgVar28;
    if (pgVar28 == (ggml_backend_t)0x0) {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to initialize CPU backend");
LAB_001d1a4a:
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
    ::emplace_back<ggml_backend*&>
              ((vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
                *)__range2,&this->backend_cpu);
    puVar9 = (this->backends).
             super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar42 = (this->backends).
                   super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar44 = local_60, puVar42 != puVar9;
        puVar42 = puVar42 + 1) {
      lVar29 = ggml_backend_get_device
                         ((puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>.
                          _M_t.super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                          super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
      if ((lVar29 != 0) && (lVar29 = ggml_backend_dev_backend_reg(lVar29), lVar29 != 0)) {
        lVar29 = ggml_backend_reg_get_proc_address(lVar29,"ggml_backend_set_n_threads");
        ggml_backend_set_n_threads_fn._0_4_ = (undefined4)lVar29;
        ggml_backend_set_n_threads_fn._4_4_ = (uint)((ulong)lVar29 >> 0x20);
        if (lVar29 != 0) {
          backend = (puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                    super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                    super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl;
          std::
          vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
          ::emplace_back<ggml_backend*,void(*&)(ggml_backend*,int)>
                    (local_58,&backend,
                     (_func_void_ggml_backend_ptr_int **)&ggml_backend_set_n_threads_fn);
        }
      }
    }
    set_abort_callback(this,params.abort_callback,params.abort_callback_data);
    uVar20 = output_reserve(this,params.n_seq_max);
    if (uVar20 < params.n_seq_max) {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to reserve initial output buffer");
      goto LAB_001d1a4a;
    }
    uVar37 = ggml_backend_buffer_name
                       ((local_80->_M_t).
                        super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
                        .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
                        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl);
    uVar30 = ggml_backend_buffer_get_size
                       ((local_80->_M_t).
                        super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
                        .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
                        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl);
    auVar48._8_4_ = (int)((ulong)uVar30 >> 0x20);
    auVar48._0_8_ = uVar30;
    auVar48._12_4_ = 0x45300000;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s  output buffer size = %8.2f MiB\n",
                       ((auVar48._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar30) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,"llama_context",uVar37);
    bVar17 = (model->hparams).vocab_only;
  }
  if ((bVar17 & 1) == 0) {
    plVar31 = (llama_kv_cache_unified *)llama_model::create_memory(model);
    plVar10 = (puVar44->_M_t).
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    (puVar44->_M_t).
    super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>._M_t
    .super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>.
    super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl = plVar31;
    if (plVar10 != (llama_kv_cache_unified *)0x0) {
      (**(code **)((long)(plVar10->super_llama_kv_cache).super_llama_memory_i + 0x78))();
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: n_ctx = %u\n","llama_context",(ulong)cparams->n_ctx
                      );
    uVar6 = cparams->n_ctx;
    uVar21 = llama_kv_cache_unified::get_padding
                       ((puVar44->_M_t).
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,cparams
                       );
    uVar22 = llama_kv_cache_unified::get_padding
                       ((puVar44->_M_t).
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,cparams
                       );
    uVar20 = -uVar22 & (uVar6 + uVar21) - 1;
    cparams->n_ctx = uVar20;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: n_ctx = %u (padded)\n","llama_context",
                       (ulong)uVar20);
    uVar6 = cparams->n_ctx;
    bVar16 = llama_model_is_recurrent(model);
    if (bVar16) {
      uVar6 = params.n_seq_max + (params.n_seq_max == 0);
      params.type_k = GGML_TYPE_F32;
      params.type_v = GGML_TYPE_F32;
    }
    uVar20 = (model->hparams).n_embd_head_k;
    lVar29 = ggml_blck_size(params.type_k);
    if (SUB168(ZEXT416(uVar20) % SEXT816(lVar29),0) != 0) {
      pcVar39 = "hparams.n_embd_head_k % ggml_blck_size(type_k) == 0";
      uVar37 = 0xca;
LAB_001d1933:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,uVar37,"GGML_ASSERT(%s) failed",pcVar39);
    }
    uVar20 = (model->hparams).n_embd_head_v;
    lVar29 = ggml_blck_size(params.type_v);
    if (SUB168(ZEXT416(uVar20) % SEXT816(lVar29),0) != 0) {
      pcVar39 = "hparams.n_embd_head_v % ggml_blck_size(type_v) == 0";
      uVar37 = 0xcb;
      goto LAB_001d1933;
    }
    iVar19 = llama_kv_cache_unified::init
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,model,
                        cparams,params.type_k,params.type_v,uVar6,(this->cparams).offload_kqv);
    if ((char)iVar19 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to initialize self-attention cache");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar32 = llama_kv_cache_unified::size_k_bytes
                       ((puVar44->_M_t).
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    sVar33 = llama_kv_cache_unified::size_v_bytes
                       ((puVar44->_M_t).
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    uVar37 = ggml_type_name(params.type_k);
    uVar30 = ggml_type_name(params.type_v);
    llama_log_internal(GGML_LOG_LEVEL_INFO,
                       "%s: KV self size  = %7.2f MiB, K (%s): %7.2f MiB, V (%s): %7.2f MiB\n",
                       (double)((float)(sVar33 + sVar32) * 9.536743e-07),
                       (double)((float)sVar32 * 9.536743e-07),(double)((float)sVar33 * 9.536743e-07)
                       ,"llama_context",uVar37,uVar30);
    bVar17 = (model->hparams).vocab_only;
  }
  if ((bVar17 & 1) != 0) goto LAB_001d13b8;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: enumerating backends\n","llama_context");
  ppgVar11 = (this->backend_buft).
             super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->backend_buft).
      super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppgVar11) {
    (this->backend_buft).
    super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppgVar11;
  }
  ppgVar12 = (this->backend_ptrs).
             super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppgVar12) {
    (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppgVar12;
  }
  puVar9 = (this->backends).
           super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar42 = (this->backends).
                 super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar9; puVar42 = puVar42 + 1
      ) {
    uVar37 = ggml_backend_get_default_buffer_type
                       ((puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>.
                        _M_t.super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                        super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
    ggml_backend_set_n_threads_fn._0_4_ = (undefined4)uVar37;
    ggml_backend_set_n_threads_fn._4_4_ = (uint)((ulong)uVar37 >> 0x20);
    uVar37 = ggml_backend_get_device
                       ((puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>.
                        _M_t.super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                        super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
    iVar19 = ggml_backend_dev_type(uVar37);
    if (((iVar19 == 0) &&
        (ppgVar43 = (model->devices).
                    super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        ppgVar43 !=
        (model->devices).
        super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) &&
       (lVar29 = ggml_backend_dev_host_buffer_type(*ppgVar43), lVar29 != 0)) {
      ggml_backend_set_n_threads_fn._0_4_ = (undefined4)lVar29;
      ggml_backend_set_n_threads_fn._4_4_ = (uint)((ulong)lVar29 >> 0x20);
    }
    std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::push_back
              (local_78,(value_type *)&ggml_backend_set_n_threads_fn);
    backend = (puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
              super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
              super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl;
    std::vector<ggml_backend*,std::allocator<ggml_backend*>>::emplace_back<ggml_backend*>
              (local_50,&backend);
  }
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: backend_ptrs.size() = %zu\n","llama_context",
                     (long)(this->backend_ptrs).
                           super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->backend_ptrs).
                           super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  iVar23 = graph_max_nodes(this);
  lVar45 = (long)iVar23;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: max_nodes = %zu\n","llama_context",lVar45);
  lVar29 = ggml_tensor_overhead();
  lVar34 = ggml_graph_overhead_custom(lVar45,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_68,lVar34 + lVar29 * lVar45);
  sVar32 = llama_model::n_devices(model);
  if (sVar32 < 2) {
LAB_001d1350:
    bVar16 = false;
  }
  else {
    bVar16 = false;
    if (((int)(model->hparams).n_layer < (model->params).n_gpu_layers) &&
       (bVar16 = false, (model->params).split_mode == LLAMA_SPLIT_MODE_LAYER)) {
      if (((this->cparams).offload_kqv != true) ||
         (bVar16 = llama_model::has_tensor_overrides(model), bVar16)) goto LAB_001d1350;
      puVar9 = (this->backends).
               super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar42 = (this->backends).
                     super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; bVar16 = puVar42 == puVar9, !bVar16;
          puVar42 = puVar42 + 1) {
        uVar37 = ggml_backend_get_device
                           ((puVar42->_M_t).
                            super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                            super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
        iVar19 = ggml_backend_dev_type(uVar37);
        if (iVar19 != 0) {
          uVar37 = ggml_backend_get_device
                             ((puVar42->_M_t).
                              super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                              super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
          ggml_backend_dev_get_props(uVar37,&ggml_backend_set_n_threads_fn);
          if ((uStack_a0._4_1_ == '\0') || ((uStack_a0 & 0x100000000000000) == 0)) break;
        }
      }
    }
  }
  ppgVar12 = (this->backend_ptrs).
             super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  __p = (pointer)ggml_backend_sched_new
                           (ppgVar12,(this->backend_buft).
                                     super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)(this->backend_ptrs).
                                          super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppgVar12) >> 3,lVar45,bVar16);
  std::__uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>::reset
            ((__uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_00,__p);
  if (bVar16 != false) {
    uVar20 = ggml_backend_sched_get_n_copies
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: pipeline parallelism enabled (n_copies=%d)\n",
                       "llama_context",(ulong)uVar20);
  }
LAB_001d13b8:
  if ((model->hparams).vocab_only == false) {
    uVar20 = (this->cparams).n_ctx;
    uVar38 = (this->cparams).n_ubatch;
    if (uVar38 < uVar20) {
      uVar20 = uVar38;
    }
    lVar24 = llama_vocab::token_bos(&model->vocab);
    backend = (ggml_backend_t)CONCAT44(backend._4_4_,lVar24);
    uVar38 = this->n_outputs;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                       "%s: worst-case: n_tokens = %d, n_seqs = %d, n_outputs = %d\n",
                       "llama_context",(ulong)uVar20,1,(ulong)uVar38);
    plVar10 = (this->kv_self)._M_t.
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    plVar10->n = plVar10->size;
    pfVar13 = (this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar13) {
      (this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar13;
    }
    ggml_backend_set_n_threads_fn._0_4_ = CONCAT31(ggml_backend_set_n_threads_fn._1_3_,1);
    local_b4 = 1;
    local_b0._8_8_ = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    this->n_outputs = uVar20;
    ggml_backend_set_n_threads_fn._4_4_ = uVar20;
    local_b8 = uVar20;
    local_b0._M_allocated_capacity = (size_type)&backend;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",(ulong)uVar20,1);
    plVar35 = (llama_ubatch *)graph_init(this);
    graph_build((llama_context *)&stack0xffffffffffffffc8,(ggml_context *)this,
                (ggml_cgraph *)
                (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,plVar35,
                (llm_graph_type)&ggml_backend_set_n_threads_fn);
    if (local_38 != (llama_model *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
    local_38 = (llama_model *)0x0;
    cVar18 = ggml_backend_sched_reserve
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,plVar35);
    if (cVar18 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to allocate compute pp buffers");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar25 = ggml_backend_sched_get_n_splits
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    iVar19 = ggml_graph_n_nodes(plVar35);
    ggml_backend_set_n_threads_fn._0_4_ = CONCAT31(ggml_backend_set_n_threads_fn._1_3_,1);
    ggml_backend_set_n_threads_fn._4_4_ = 1;
    local_b8 = 1;
    local_b0._8_8_ = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    this->n_outputs = 1;
    local_b4 = 1;
    local_b0._M_allocated_capacity = (size_type)&backend;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",1,1);
    plVar35 = (llama_ubatch *)graph_init(this);
    graph_build((llama_context *)local_40,(ggml_context *)this,
                (ggml_cgraph *)
                (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,plVar35,
                (llm_graph_type)&ggml_backend_set_n_threads_fn);
    if (local_40 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
    local_40 = (undefined1  [8])0x0;
    cVar18 = ggml_backend_sched_reserve
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,plVar35);
    if (cVar18 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to allocate compute tg buffers");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar26 = ggml_backend_sched_get_n_splits
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    local_6c = ggml_graph_n_nodes(plVar35);
    ggml_backend_set_n_threads_fn._0_4_ = CONCAT31(ggml_backend_set_n_threads_fn._1_3_,1);
    local_b4 = 1;
    local_b0._8_8_ = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    this->n_outputs = uVar20;
    ggml_backend_set_n_threads_fn._4_4_ = uVar20;
    local_b8 = uVar20;
    local_b0._M_allocated_capacity = (size_type)&backend;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",(ulong)uVar20,1);
    plVar35 = (llama_ubatch *)graph_init(this);
    graph_build((llama_context *)local_48,(ggml_context *)this,
                (ggml_cgraph *)
                (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,plVar35,
                (llm_graph_type)&ggml_backend_set_n_threads_fn);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
    local_48 = (undefined1  [8])0x0;
    cVar18 = ggml_backend_sched_reserve
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,plVar35);
    local_d4 = uVar26;
    local_d0 = uVar25;
    local_cc = uVar20;
    if (cVar18 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to allocate compute pp buffers");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->n_outputs = uVar38;
    for (uVar41 = 0; uVar20 = local_cc,
        ppgVar12 = (this->backend_ptrs).
                   super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
        uVar41 < (ulong)((long)(this->backend_ptrs).
                               super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppgVar12 >> 3);
        uVar41 = uVar41 + 1) {
      pgVar14 = (local_78->
                super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar41];
      uVar27 = ggml_backend_sched_get_buffer_size
                         ((this_00->_M_t).
                          super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t
                          .super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                          super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                          ppgVar12[uVar41]);
      if (1 < uVar27) {
        uVar37 = ggml_backend_buft_name(pgVar14);
        auVar49._8_4_ = (int)(uVar27 >> 0x20);
        auVar49._0_8_ = uVar27;
        auVar49._12_4_ = 0x45300000;
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s compute buffer size = %8.2f MiB\n",
                           ((auVar49._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar27) - 4503599627370496.0)) *
                           0.0009765625 * 0.0009765625,"llama_context",uVar37);
      }
    }
    if (iVar19 == local_6c) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph nodes  = %d\n","llama_context");
      uVar20 = local_cc;
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph nodes  = %d (with bs=%d), %d (with bs=1)\n",
                         "llama_context",iVar19,(ulong)local_cc);
    }
    if (local_d0 == local_d4) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph splits = %d\n","llama_context");
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph splits = %d (with bs=%d), %d (with bs=1)\n",
                         "llama_context",(ulong)local_d0,(ulong)uVar20);
    }
  }
  return;
}

Assistant:

llama_context::llama_context(
        const llama_model & model,
              llama_context_params params) :
    model(model) {
    LLAMA_LOG_INFO("%s: constructing llama_context\n", __func__);

    t_start_us = model.t_start_us;
    t_load_us  = model.t_load_us;

    const auto & hparams = model.hparams;

    cparams.n_seq_max        = std::max(1u, params.n_seq_max);
    cparams.n_threads        = params.n_threads;
    cparams.n_threads_batch  = params.n_threads_batch;
    cparams.yarn_ext_factor  = params.yarn_ext_factor;
    cparams.yarn_attn_factor = params.yarn_attn_factor;
    cparams.yarn_beta_fast   = params.yarn_beta_fast;
    cparams.yarn_beta_slow   = params.yarn_beta_slow;
    cparams.defrag_thold     = params.defrag_thold;
    cparams.embeddings       = params.embeddings;
    cparams.offload_kqv      = params.offload_kqv;
    cparams.flash_attn       = params.flash_attn;
    cparams.no_perf          = params.no_perf;
    cparams.pooling_type     = params.pooling_type;
    cparams.warmup           = false;

    cparams.n_ctx            = params.n_ctx           == 0    ? hparams.n_ctx_train           : params.n_ctx;
    cparams.rope_freq_base   = params.rope_freq_base  == 0.0f ? hparams.rope_freq_base_train  : params.rope_freq_base;
    cparams.rope_freq_scale  = params.rope_freq_scale == 0.0f ? hparams.rope_freq_scale_train : params.rope_freq_scale;

    cparams.n_ctx_orig_yarn  = params.yarn_orig_ctx    != 0 ? params.yarn_orig_ctx    :
                               hparams.n_ctx_orig_yarn != 0 ? hparams.n_ctx_orig_yarn :
                                                              hparams.n_ctx_train;

    cparams.cb_eval           = params.cb_eval;
    cparams.cb_eval_user_data = params.cb_eval_user_data;

    auto rope_scaling_type = params.rope_scaling_type;
    if (rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_UNSPECIFIED) {
        rope_scaling_type = hparams.rope_scaling_type_train;
    }

    if (rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_NONE) {
        cparams.rope_freq_scale = 1.0f; // never scale if scaling type is none
    }

    if (cparams.yarn_ext_factor < 0.0f) { // negative indicates 'not set'
        cparams.yarn_ext_factor = rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_YARN ? 1.0f : 0.0f;
    }

    cparams.yarn_attn_factor *= hparams.rope_attn_factor;

    if (cparams.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
        if (hparams.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
            cparams.pooling_type = LLAMA_POOLING_TYPE_NONE;
        } else {
            cparams.pooling_type = hparams.pooling_type;
        }
    }

    if (params.attention_type == LLAMA_ATTENTION_TYPE_UNSPECIFIED) {
        cparams.causal_attn = hparams.causal_attn;
    } else {
        cparams.causal_attn = params.attention_type == LLAMA_ATTENTION_TYPE_CAUSAL;
    }

    // with causal attention, the batch size is limited by the context size
    cparams.n_batch = cparams.causal_attn ? std::min(cparams.n_ctx, params.n_batch) : params.n_batch;

    // the batch has to be at least GGML_KQ_MASK_PAD because we will be padding the KQ_mask
    // this is required by GPU kernels in order to avoid out-of-bounds accesses (e.g. ggml_flash_attn_ext)
    // ref: https://github.com/ggerganov/llama.cpp/pull/5021
    // TODO: this padding is not needed for the cache-less context so we should probably move it to llama_context_kv_self
    if (cparams.n_batch < GGML_KQ_MASK_PAD) {
        LLAMA_LOG_WARN("%s: n_batch is less than GGML_KQ_MASK_PAD - increasing to %d\n", __func__, GGML_KQ_MASK_PAD);
        cparams.n_batch = GGML_KQ_MASK_PAD;
    }

    cparams.n_ubatch = std::min(cparams.n_batch, params.n_ubatch == 0 ? params.n_batch : params.n_ubatch);

    const uint32_t n_ctx_per_seq = cparams.n_ctx / cparams.n_seq_max;

    LLAMA_LOG_INFO("%s: n_seq_max     = %u\n",   __func__, cparams.n_seq_max);
    LLAMA_LOG_INFO("%s: n_ctx         = %u\n",   __func__, cparams.n_ctx);
    LLAMA_LOG_INFO("%s: n_ctx_per_seq = %u\n",   __func__, n_ctx_per_seq);
    LLAMA_LOG_INFO("%s: n_batch       = %u\n",   __func__, cparams.n_batch);
    LLAMA_LOG_INFO("%s: n_ubatch      = %u\n",   __func__, cparams.n_ubatch);
    LLAMA_LOG_INFO("%s: causal_attn   = %d\n",   __func__, cparams.causal_attn);
    LLAMA_LOG_INFO("%s: flash_attn    = %d\n",   __func__, cparams.flash_attn);
    LLAMA_LOG_INFO("%s: freq_base     = %.1f\n", __func__, cparams.rope_freq_base);
    LLAMA_LOG_INFO("%s: freq_scale    = %g\n",   __func__, cparams.rope_freq_scale);

    if (n_ctx_per_seq < hparams.n_ctx_train) {
        LLAMA_LOG_WARN("%s: n_ctx_per_seq (%u) < n_ctx_train (%u) -- the full capacity of the model will not be utilized\n",
                __func__, n_ctx_per_seq, hparams.n_ctx_train);
    }

    if (n_ctx_per_seq > hparams.n_ctx_train) {
        LLAMA_LOG_WARN("%s: n_ctx_pre_seq (%u) > n_ctx_train (%u) -- possible training context overflow\n",
                __func__, n_ctx_per_seq, hparams.n_ctx_train);
    }

    logits_all = params.logits_all;

    if (!hparams.vocab_only) {
        // GPU backends
        for (auto * dev : model.devices) {
            ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
            if (backend == nullptr) {
                throw std::runtime_error(format("failed to initialize %s backend", ggml_backend_dev_name(dev)));
            }
            backends.emplace_back(backend);
        }

        // add ACCEL backends (such as BLAS)
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev = ggml_backend_dev_get(i);
            if (ggml_backend_dev_type(dev) == GGML_BACKEND_DEVICE_TYPE_ACCEL) {
                ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
                if (backend == nullptr) {
                    throw std::runtime_error(format("failed to initialize %s backend", ggml_backend_dev_name(dev)));
                }
                backends.emplace_back(backend);
            }
        }

        // add CPU backend
        backend_cpu = ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr);
        if (backend_cpu == nullptr) {
            throw std::runtime_error("failed to initialize CPU backend");
        }
        backends.emplace_back(backend_cpu);

        // create a list of the set_n_threads functions in the backends
        for (auto & backend : backends) {
            ggml_backend_dev_t dev = ggml_backend_get_device(backend.get());
            ggml_backend_reg_t reg = dev ? ggml_backend_dev_backend_reg(dev) : nullptr;
            if (reg) {
                auto ggml_backend_set_n_threads_fn = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
                if (ggml_backend_set_n_threads_fn) {
                    set_n_threads_fns.emplace_back(backend.get(), ggml_backend_set_n_threads_fn);
                }
            }
        }

        llama_set_abort_callback(this, params.abort_callback, params.abort_callback_data);

        // graph outputs buffer
        {
            // resized during inference when a batch uses more outputs
            if ((uint32_t) output_reserve(params.n_seq_max) < params.n_seq_max) {
                throw std::runtime_error("failed to reserve initial output buffer");
            }

            LLAMA_LOG_INFO("%s: %10s  output buffer size = %8.2f MiB\n", __func__,
                    ggml_backend_buffer_name    (buf_output.get()),
                    ggml_backend_buffer_get_size(buf_output.get()) / 1024.0 / 1024.0);
        }
    }

    // init the memory module
    // TODO: for now, always create a unified KV cache
    if (!hparams.vocab_only) {
        kv_self.reset(static_cast<llama_kv_cache_unified *>(model.create_memory()));

        LLAMA_LOG_DEBUG("%s: n_ctx = %u\n", __func__, cparams.n_ctx);

        cparams.n_ctx = GGML_PAD(cparams.n_ctx, kv_self->get_padding(cparams));

        LLAMA_LOG_DEBUG("%s: n_ctx = %u (padded)\n", __func__, cparams.n_ctx);

        uint32_t kv_size = cparams.n_ctx;
        ggml_type type_k = params.type_k;
        ggml_type type_v = params.type_v;

        if (llama_model_is_recurrent(&model)) {
            // Mamba needs at least as many KV cells as there are sequences kept at any time
            kv_size = std::max((uint32_t) 1, params.n_seq_max);
            // it's probably best to keep as much precision as possible for the states
            type_k = GGML_TYPE_F32; // required by ggml_ssm_conv for Mamba's conv_states
            type_v = GGML_TYPE_F32; // required by ggml_ssm_scan for Mamba's ssm_states
        }

        GGML_ASSERT(hparams.n_embd_head_k % ggml_blck_size(type_k) == 0);
        GGML_ASSERT(hparams.n_embd_head_v % ggml_blck_size(type_v) == 0);

        if (!kv_self->init(model, cparams, type_k, type_v, kv_size, cparams.offload_kqv)) {
            throw std::runtime_error("failed to initialize self-attention cache");
        }

        {
            const size_t memory_size_k = kv_self->size_k_bytes();
            const size_t memory_size_v = kv_self->size_v_bytes();

            LLAMA_LOG_INFO("%s: KV self size  = %7.2f MiB, K (%s): %7.2f MiB, V (%s): %7.2f MiB\n", __func__,
                    (float)(memory_size_k + memory_size_v) / (1024.0f * 1024.0f),
                    ggml_type_name(type_k), (float)memory_size_k / (1024.0f * 1024.0f),
                    ggml_type_name(type_v), (float)memory_size_v / (1024.0f * 1024.0f));
        }
    }

    // init backends
    if (!hparams.vocab_only) {
        LLAMA_LOG_DEBUG("%s: enumerating backends\n", __func__);

        backend_buft.clear();
        backend_ptrs.clear();

        for (auto & backend : backends) {
            auto * buft = ggml_backend_get_default_buffer_type(backend.get());
            auto backend_type = ggml_backend_dev_type(ggml_backend_get_device(backend.get()));

            if (backend_type == GGML_BACKEND_DEVICE_TYPE_CPU && !model.devices.empty()) {
                // use the host buffer of the first device CPU for faster transfer of the intermediate state
                auto * dev = model.devices[0];
                auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
                if (host_buft) {
                    buft = host_buft;
                }
            }

            backend_buft.push_back(buft);
            backend_ptrs.push_back(backend.get());
        }

        LLAMA_LOG_DEBUG("%s: backend_ptrs.size() = %zu\n", __func__, backend_ptrs.size());

        const size_t max_nodes = this->graph_max_nodes();

        LLAMA_LOG_DEBUG("%s: max_nodes = %zu\n", __func__, max_nodes);

        // buffer used to store the computation graph and the tensor meta data
        buf_compute_meta.resize(ggml_tensor_overhead()*max_nodes + ggml_graph_overhead_custom(max_nodes, false));

        // TODO: move these checks to ggml_backend_sched
        // enabling pipeline parallelism in the scheduler increases memory usage, so it is only done when necessary
        bool pipeline_parallel =
            model.n_devices() > 1 &&
            model.params.n_gpu_layers > (int) model.hparams.n_layer &&
            model.params.split_mode == LLAMA_SPLIT_MODE_LAYER &&
            cparams.offload_kqv &&
            !model.has_tensor_overrides();

        // pipeline parallelism requires support for async compute and events in all devices
        if (pipeline_parallel) {
            for (auto & backend : backends) {
                auto dev_type = ggml_backend_dev_type(ggml_backend_get_device(backend.get()));
                if (dev_type == GGML_BACKEND_DEVICE_TYPE_CPU) {
                    // ignore CPU backend
                    continue;
                }
                auto * dev = ggml_backend_get_device(backend.get());
                ggml_backend_dev_props props;
                ggml_backend_dev_get_props(dev, &props);
                if (!props.caps.async || !props.caps.events) {
                    // device does not support async compute or events
                    pipeline_parallel = false;
                    break;
                }
            }
        }

        sched.reset(ggml_backend_sched_new(backend_ptrs.data(), backend_buft.data(), backend_ptrs.size(), max_nodes, pipeline_parallel));

        if (pipeline_parallel) {
            LLAMA_LOG_INFO("%s: pipeline parallelism enabled (n_copies=%d)\n", __func__, ggml_backend_sched_get_n_copies(sched.get()));
        }
    }

    // reserve worst-case graph
    if (!hparams.vocab_only) {
        const uint32_t n_seqs = 1; // TODO: worst-case number of sequences
        const uint32_t n_tokens = std::min(cparams.n_ctx, cparams.n_ubatch);

        llama_token token = model.vocab.token_bos(); // not actually used by llama_build_graph, but required to choose between token and embedding inputs graph

        // restore later
        // TODO: something cleaner
        const auto n_outputs_save = n_outputs;

        LLAMA_LOG_DEBUG("%s: worst-case: n_tokens = %d, n_seqs = %d, n_outputs = %d\n", __func__, n_tokens, n_seqs, n_outputs);

        int n_splits_pp = -1;
        int n_nodes_pp  = -1;

        int n_splits_tg = -1;
        int n_nodes_tg  = -1;

        // simulate full KV cache
        kv_self->n = kv_self->size;

        cross.v_embd.clear();

        // reserve pp graph first so that buffers are only allocated once
        {
            llama_ubatch ubatch_pp = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            // max number of outputs
            n_outputs = ubatch_pp.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_pp.n_tokens, ubatch_pp.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_pp, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute pp buffers");
            }

            n_splits_pp = ggml_backend_sched_get_n_splits(sched.get());
            n_nodes_pp  = ggml_graph_n_nodes(gf);
        }

        // reserve with tg graph to get the number of splits and nodes
        {
            llama_ubatch ubatch_tg = { true, 1, 1, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            n_outputs = ubatch_tg.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_tg.n_tokens, ubatch_tg.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_tg, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute tg buffers");
            }

            n_splits_tg = ggml_backend_sched_get_n_splits(sched.get());
            n_nodes_tg  = ggml_graph_n_nodes(gf);
        }

        // reserve again with pp graph to avoid ggml-alloc reallocations during inference
        {
            llama_ubatch ubatch_pp = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            n_outputs = ubatch_pp.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_pp.n_tokens, ubatch_pp.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_pp, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute pp buffers");
            }
        }

        n_outputs = n_outputs_save;

        for (size_t i = 0; i < backend_ptrs.size(); ++i) {
            ggml_backend_t             backend = backend_ptrs[i];
            ggml_backend_buffer_type_t buft    = backend_buft[i];
            size_t size = ggml_backend_sched_get_buffer_size(sched.get(), backend);
            if (size > 1) {
                LLAMA_LOG_INFO("%s: %10s compute buffer size = %8.2f MiB\n", __func__,
                        ggml_backend_buft_name(buft),
                        size / 1024.0 / 1024.0);
            }
        }

        if (n_nodes_pp == n_nodes_tg) {
            LLAMA_LOG_INFO("%s: graph nodes  = %d\n", __func__, n_nodes_pp);
        } else {
            LLAMA_LOG_INFO("%s: graph nodes  = %d (with bs=%d), %d (with bs=1)\n", __func__, n_nodes_pp, n_tokens, n_nodes_tg);
        }

        if (n_splits_pp == n_splits_tg) {
            LLAMA_LOG_INFO("%s: graph splits = %d\n", __func__, n_splits_pp);
        } else {
            LLAMA_LOG_INFO("%s: graph splits = %d (with bs=%d), %d (with bs=1)\n", __func__, n_splits_pp, n_tokens, n_splits_tg);
        }
    }
}